

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_join.cpp
# Opt level: O1

void __thiscall
duckdb::StatisticsPropagator::MultiplyCardinalities
          (StatisticsPropagator *this,
          unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
          *stats,NodeStatistics *new_stats)

{
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> _Var1;
  hugeint_t lhs;
  bool bVar2;
  pointer pNVar3;
  long lVar4;
  InternalException *this_00;
  ulong uVar5;
  hugeint_t hVar6;
  hugeint_t input;
  int64_t result;
  hugeint_t new_max;
  uint64_t in_stack_ffffffffffffff88;
  uint64_t in_stack_ffffffffffffff90;
  Hugeint *this_01;
  uint64_t in_stack_ffffffffffffff98;
  uint64_t uVar7;
  _Alloc_hider in_stack_ffffffffffffffa0;
  hugeint_t local_40;
  hugeint_t local_30;
  
  pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->(stats);
  if ((((pNVar3->has_estimated_cardinality != true) ||
       (new_stats->has_estimated_cardinality != true)) ||
      (pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                ::operator->(stats), pNVar3->has_max_cardinality != true)) ||
     (new_stats->has_max_cardinality == false)) {
    _Var1._M_head_impl =
         (stats->
         super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
         .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl;
    (stats->super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>).
    _M_t.super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>.
    super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl = (NodeStatistics *)0x0;
    if (_Var1._M_head_impl == (NodeStatistics *)0x0) {
      return;
    }
    operator_delete(_Var1._M_head_impl);
    return;
  }
  pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->(stats);
  uVar5 = new_stats->estimated_cardinality;
  if (new_stats->estimated_cardinality < pNVar3->estimated_cardinality) {
    uVar5 = pNVar3->estimated_cardinality;
  }
  pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->(stats);
  pNVar3->estimated_cardinality = uVar5;
  pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->(stats);
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pNVar3->max_cardinality);
  hugeint_t::hugeint_t(&local_30,lVar4);
  lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(new_stats->max_cardinality);
  hugeint_t::hugeint_t(&local_40,lVar4);
  lhs.upper = (int64_t)in_stack_ffffffffffffffa0._M_p;
  lhs.lower = in_stack_ffffffffffffff98;
  hVar6.upper = in_stack_ffffffffffffff90;
  hVar6.lower = in_stack_ffffffffffffff88;
  hVar6 = Hugeint::Multiply<true>(lhs,hVar6);
  this_01 = (Hugeint *)hVar6.lower;
  uVar7 = hVar6.upper;
  hugeint_t::hugeint_t((hugeint_t *)&stack0xffffffffffffffa0,0x7fffffffffffffff);
  bVar2 = hugeint_t::operator<
                    ((hugeint_t *)&stack0xffffffffffffff90,(hugeint_t *)&stack0xffffffffffffffa0);
  if (bVar2) {
    input.upper = (int64_t)&stack0xffffffffffffff88;
    input.lower = uVar7;
    bVar2 = Hugeint::TryCast<long>(this_01,input,(int64_t *)local_40.upper);
    if (bVar2) {
      pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
               ::operator->(stats);
      pNVar3->max_cardinality = in_stack_ffffffffffffff88;
      return;
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffa0,"Overflow in cast in statistics propagation","");
    InternalException::InternalException(this_00,(string *)&stack0xffffffffffffffa0);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  _Var1._M_head_impl =
       (stats->
       super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)._M_t.
       super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
       .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl;
  (stats->super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>).
  _M_t.super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>.
  super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl = (NodeStatistics *)0x0;
  if (_Var1._M_head_impl == (NodeStatistics *)0x0) {
    return;
  }
  operator_delete(_Var1._M_head_impl);
  return;
}

Assistant:

void StatisticsPropagator::MultiplyCardinalities(unique_ptr<NodeStatistics> &stats, NodeStatistics &new_stats) {
	if (!stats->has_estimated_cardinality || !new_stats.has_estimated_cardinality || !stats->has_max_cardinality ||
	    !new_stats.has_max_cardinality) {
		stats = nullptr;
		return;
	}
	stats->estimated_cardinality = MaxValue<idx_t>(stats->estimated_cardinality, new_stats.estimated_cardinality);
	auto new_max = Hugeint::Multiply(NumericCast<int64_t>(stats->max_cardinality),
	                                 NumericCast<int64_t>(new_stats.max_cardinality));
	if (new_max < NumericLimits<int64_t>::Maximum()) {
		int64_t result;
		if (!Hugeint::TryCast<int64_t>(new_max, result)) {
			throw InternalException("Overflow in cast in statistics propagation");
		}
		D_ASSERT(result >= 0);
		stats->max_cardinality = idx_t(result);
	} else {
		stats = nullptr;
	}
}